

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::textureTypeExtensionShaderRequires_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,TextureType type,
          RenderContext *renderContext)

{
  bool bVar1;
  ContextType ctxType;
  undefined4 in_register_00000014;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(**(code **)(*(long *)CONCAT44(in_register_00000014,type) + 0x10))
                          ((long *)CONCAT44(in_register_00000014,type));
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (((int)this != 7) || (bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,SSBOArrayLengthTests::init::arraysSized + 1,
               (allocator<char> *)&local_58);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_EXT_texture_buffer",&local_59);
    std::operator+(&local_58,"#extension ",&local_38);
    std::operator+(__return_storage_ptr__,&local_58," : require\n");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline string textureTypeExtensionShaderRequires (TextureType type, const RenderContext& renderContext)
{
	if (!glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2)) && (type == TEXTURETYPE_BUFFER))
		return "#extension " + string(s_texBufExtString) + " : require\n";
	else
		return "";
}